

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

void __thiscall jrtplib::RTPUDPv6Transmitter::ClearAcceptIgnoreInfo(RTPUDPv6Transmitter *this)

{
  PortInfo *pPVar1;
  RTPMemoryManager *pRVar2;
  _List_node_base *p_Var3;
  HashElement *pHVar4;
  _List_node_base *p_Var5;
  HashElement *pHVar6;
  
  pHVar6 = (this->acceptignoreinfo).firsthashelem;
  (this->acceptignoreinfo).curhashelem = pHVar6;
  if (pHVar6 == (HashElement *)0x0) {
    memset((this->acceptignoreinfo).table,0,0x103e8);
  }
  else {
    do {
      pPVar1 = pHVar6->element;
      pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        if (pPVar1 != (PortInfo *)0x0) {
          p_Var5 = (pPVar1->portlist).
                   super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node
                   .super__List_node_base._M_next;
          while (p_Var5 != (_List_node_base *)&pPVar1->portlist) {
            p_Var3 = p_Var5->_M_next;
            operator_delete(p_Var5,0x18);
            p_Var5 = p_Var3;
          }
        }
        operator_delete(pPVar1,0x20);
      }
      else {
        p_Var5 = (pPVar1->portlist).
                 super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        while (p_Var5 != (_List_node_base *)&pPVar1->portlist) {
          p_Var3 = p_Var5->_M_next;
          operator_delete(p_Var5,0x18);
          p_Var5 = p_Var3;
        }
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2);
      }
      pHVar6 = (this->acceptignoreinfo).curhashelem;
      if (pHVar6 == (HashElement *)0x0) break;
      pHVar6 = pHVar6->listnext;
      (this->acceptignoreinfo).curhashelem = pHVar6;
    } while (pHVar6 != (HashElement *)0x0);
    pHVar6 = (this->acceptignoreinfo).firsthashelem;
    memset((this->acceptignoreinfo).table,0,0x103e8);
    while (pHVar6 != (HashElement *)0x0) {
      pHVar4 = pHVar6->listnext;
      pRVar2 = (this->acceptignoreinfo).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        operator_delete(pHVar6,0x40);
        pHVar6 = pHVar4;
      }
      else {
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pHVar6);
        pHVar6 = pHVar4;
      }
    }
  }
  (this->acceptignoreinfo).firsthashelem = (HashElement *)0x0;
  (this->acceptignoreinfo).lasthashelem = (HashElement *)0x0;
  return;
}

Assistant:

void RTPUDPv6Transmitter::ClearAcceptIgnoreInfo()
{
	acceptignoreinfo.GotoFirstElement();
	while (acceptignoreinfo.HasCurrentElement())
	{
		PortInfo *inf;

		inf = acceptignoreinfo.GetCurrentElement();
		RTPDelete(inf,GetMemoryManager());
		acceptignoreinfo.GotoNextElement();
	}
	acceptignoreinfo.Clear();
}